

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndication_Init.cpp
# Opt level: O2

bool __thiscall
SRUP_MSG_SYNDICATION_INIT::DeSerialize(SRUP_MSG_SYNDICATION_INIT *this,uint8_t *serial_data)

{
  uint64_t *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  long lVar4;
  uint8_t (*pauVar5) [8];
  uint8_t *puVar6;
  char *pcVar7;
  ulong uVar8;
  char *__salt;
  uint8_t bytes [2];
  uint8_t snd_bytes [8];
  uint8_t sid_bytes [8];
  
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_msgtype = serial_data[1];
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    sid_bytes[lVar4] = serial_data[lVar4 + 2];
  }
  puVar1 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID;
  if (puVar1 != (uint64_t *)0x0) {
    operator_delete(puVar1);
  }
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID = (uint64_t *)pauVar5;
  *pauVar5 = sid_bytes;
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    snd_bytes[lVar4] = serial_data[lVar4 + 10];
  }
  puVar1 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID;
  if (puVar1 != (uint64_t *)0x0) {
    operator_delete(puVar1);
  }
  pauVar5 = (uint8_t (*) [8])operator_new(8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID = (uint64_t *)pauVar5;
  *pauVar5 = snd_bytes;
  bytes = *(uint8_t (*) [2])(serial_data + 0x12);
  uVar2 = SRUP_MSG::decodeLength(bytes);
  puVar6 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  uVar8 = (ulong)uVar2;
  puVar6 = (uint8_t *)operator_new__(uVar8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token = puVar6;
  memcpy(puVar6,serial_data + 0x14,uVar8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len = uVar2;
  bytes = *(uint8_t (*) [2])(serial_data + uVar8 + 0x14);
  uVar3 = SRUP_MSG::decodeLength(bytes);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sig_len = uVar3;
  puVar6 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  uVar8 = (ulong)uVar3;
  puVar6 = (uint8_t *)operator_new__(uVar8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature = puVar6;
  memcpy(puVar6,serial_data + (uVar2 + 0x16),uVar8);
  lVar4 = (uVar2 + 0x16) + uVar8;
  bytes = *(uint8_t (*) [2])(serial_data + lVar4);
  uVar2 = SRUP_MSG::decodeLength(bytes);
  if (this->m_url != (char *)0x0) {
    operator_delete__(this->m_url);
  }
  uVar8 = (ulong)uVar2;
  pcVar7 = (char *)operator_new__((ulong)(uVar2 + 1));
  this->m_url = pcVar7;
  memcpy(pcVar7,serial_data + lVar4 + 2,uVar8);
  pcVar7[uVar8] = '\0';
  this->m_url_len = uVar2;
  bytes = *(uint8_t (*) [2])(serial_data + uVar8 + lVar4 + 4 + -2);
  uVar2 = SRUP_MSG::decodeLength(bytes);
  __salt = (char *)(ulong)uVar2;
  pcVar7 = (char *)operator_new__((ulong)__salt);
  memcpy(pcVar7,serial_data + uVar8 + lVar4 + 4,(size_t)__salt);
  SRUP_Crypto::crypt((this->super_SRUP_MSG_OBS_BASE).m_crypto,pcVar7,__salt);
  operator_delete__(pcVar7);
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATION_INIT::DeSerialize (const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    // Reconstructing it from the 8x uint8_t's we have in the bytestream...
    // First we get the 8-bytes...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Again we have to do the same trick to unmarshall the sender ID...
    // Reconstructing it from the 8x uint8_t's we have in the bytestream...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sender_ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now the token - the last of the "generic" fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // Most of the rest of the fields are simpler...

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new uint8_t[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Now finally on to the remaining (simple) fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_url;
    m_url = new char[x+1];
    std::memcpy(m_url, (uint8_t *) serial_data + p, x);
    *(m_url + x) = 0;
    m_url_len = x;
    p+=x;

    // Lastly we have the encrypted data.
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    auto* encrypted_data = new uint8_t[x];

    std::memcpy(encrypted_data, (uint8_t *) serial_data + p, x);
    m_crypto->crypt(encrypted_data, x);

    delete[] encrypted_data;

    return true;
}